

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O0

void time_update(void)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  __type_conflict2 _Var5;
  AREA_DATA_conflict *area;
  DESCRIPTOR_DATA *d;
  char bw4 [4608];
  char bw3 [4608];
  char bw2 [4608];
  char bw1 [4608];
  char colbuf [4608];
  char buf [4608];
  ulong in_stack_ffffffffffff93c0;
  CHAR_DATA *in_stack_ffffffffffff93c8;
  CHAR_DATA *in_stack_ffffffffffff93d0;
  char *in_stack_ffffffffffff93d8;
  char *in_stack_ffffffffffff93e0;
  AREA_DATA_conflict *local_6c18;
  DESCRIPTOR_DATA *local_6c10;
  char local_6c08 [4608];
  char local_5a08 [4608];
  char local_4808 [4608];
  char local_3608 [9216];
  char local_1208 [4616];
  
  local_1208[0] = '\0';
  sprintf(local_3608,"{rA ruddy glow fills the eastern sky as dawn approaches.{x");
  sprintf(local_4808,
          "{YThe sky brightens as the great flaming disc peers above the eastern horizon.{x");
  sprintf(local_5a08,"{MThe sun slowly disappears below the western horizon.{x");
  sprintf(local_6c08,"{mThe violet glow leaves the western sky as evening gives way to night.{x");
  if ((time_info.half & 1U) == 0) {
    time_info.half = true;
  }
  else {
    time_info.half = false;
    in_stack_ffffffffffff93e0 = (char *)(ulong)(uint)time_info.season;
    switch(in_stack_ffffffffffff93e0) {
    case (char *)0x0:
      iVar3 = time_info.hour + 1;
      in_stack_ffffffffffff93d8 = (char *)(ulong)(time_info.hour - 6);
      time_info.hour = iVar3;
      switch(in_stack_ffffffffffff93d8) {
      case (char *)0x0:
        sun = 1;
        sprintf(local_1208,"%s",local_3608);
        break;
      case (char *)0x1:
        sun = 2;
        sprintf(local_1208,"%s",local_4808);
        break;
      case (char *)0x9:
        sun = 3;
        sprintf(local_1208,"%s",local_5a08);
        break;
      case (char *)0xa:
        sun = 0;
        sprintf(local_1208,"%s",local_6c08);
        break;
      case (char *)0x11:
        time_info.hour = 0;
        time_info.day = time_info.day + 1;
      }
      break;
    case (char *)0x1:
      iVar3 = time_info.hour + 1;
      in_stack_ffffffffffff93d0 = (CHAR_DATA *)(ulong)(time_info.hour - 5);
      time_info.hour = iVar3;
      switch(in_stack_ffffffffffff93d0) {
      case (CHAR_DATA *)0x0:
        sun = 1;
        sprintf(local_1208,"%s",local_3608);
        break;
      case (CHAR_DATA *)0x1:
        sun = 2;
        sprintf(local_1208,"%s",local_4808);
        break;
      case (CHAR_DATA *)0xc:
        sun = 3;
        sprintf(local_1208,"%s",local_5a08);
        break;
      case (CHAR_DATA *)0xd:
        sun = 0;
        sprintf(local_1208,"%s",local_6c08);
        break;
      case (CHAR_DATA *)0x12:
        time_info.hour = 0;
        time_info.day = time_info.day + 1;
      }
      break;
    case (char *)0x2:
      iVar3 = time_info.hour + 1;
      in_stack_ffffffffffff93c8 = (CHAR_DATA *)(ulong)(time_info.hour - 4);
      time_info.hour = iVar3;
      switch(in_stack_ffffffffffff93c8) {
      case (CHAR_DATA *)0x0:
        sun = 1;
        sprintf(local_1208,"%s",local_3608);
        break;
      case (CHAR_DATA *)0x1:
        sun = 2;
        sprintf(local_1208,"%s",local_4808);
        break;
      case (CHAR_DATA *)0xf:
        sun = 3;
        sprintf(local_1208,"%s",local_5a08);
        break;
      case (CHAR_DATA *)0x10:
        sun = 0;
        sprintf(local_1208,"%s",local_6c08);
        break;
      case (CHAR_DATA *)0x13:
        time_info.hour = 0;
        time_info.day = time_info.day + 1;
      }
      break;
    case (char *)0x3:
      iVar3 = time_info.hour + 1;
      in_stack_ffffffffffff93c0 = (ulong)(time_info.hour - 5);
      time_info.hour = iVar3;
      switch(in_stack_ffffffffffff93c0) {
      case 0:
        sun = 1;
        sprintf(local_1208,"%s",local_3608);
        break;
      case 1:
        sun = 2;
        sprintf(local_1208,"%s",local_4808);
        break;
      case 0xc:
        sun = 3;
        sprintf(local_1208,"%s",local_5a08);
        break;
      case 0xd:
        sun = 0;
        sprintf(local_1208,"%s",local_6c08);
        break;
      case 0x12:
        time_info.hour = 0;
        time_info.day = time_info.day + 1;
      }
    }
    if (0x1d < time_info.day) {
      time_info.day = 0;
      iVar4 = time_info.month + 1;
      iVar3 = time_info.month + 2;
      time_info.month = iVar4;
      if ((iVar3 % 3 == 0) && (time_info.season = time_info.season + 1, 3 < time_info.season)) {
        time_info.season = 0;
      }
    }
    if (0xb < time_info.month) {
      time_info.month = 0;
      time_info.year = time_info.year + 1;
    }
  }
  if (local_1208[0] != '\0') {
    for (local_6c10 = descriptor_list; local_6c10 != (DESCRIPTOR_DATA *)0x0;
        local_6c10 = local_6c10->next) {
      if ((((((local_6c10->connected == 0) &&
             (local_6c10->character->in_room != (ROOM_INDEX_DATA *)0x0)) &&
            (local_6c10->character->in_room->sector_type != 8)) &&
           ((bVar2 = is_outside(in_stack_ffffffffffff93c8), bVar2 &&
            (bVar2 = is_awake(local_6c10->character), bVar2)))) &&
          ((bVar2 = is_editing(local_6c10->character), !bVar2 &&
           ((bVar2 = is_affected_area(local_6c10->character->in_room->area,(int)gsn_whiteout),
            !bVar2 && (bVar2 = is_affected_area(local_6c10->character->in_room->area,
                                                (int)gsn_cyclone), !bVar2)))))) &&
         (bVar2 = is_affected_by(in_stack_ffffffffffff93c8,(int)(in_stack_ffffffffffff93c0 >> 0x20))
         , !bVar2)) {
        colorconv(in_stack_ffffffffffff93e0,in_stack_ffffffffffff93d8,in_stack_ffffffffffff93d0);
        send_to_char((char *)in_stack_ffffffffffff93d0,in_stack_ffffffffffff93c8);
        send_to_char((char *)in_stack_ffffffffffff93d0,in_stack_ffffffffffff93c8);
      }
    }
  }
  if (local_1208[0] != '\0') {
    for (local_6c18 = area_first; local_6c18 != (AREA_DATA_conflict *)0x0;
        local_6c18 = local_6c18->next) {
      uVar1 = local_6c18->progtypes[0];
      _Var5 = std::pow<int,int>(0,0x638f39);
      if ((uVar1 & (long)_Var5) != 0) {
        (*(code *)local_6c18->aprogs->sun_prog)(local_6c18);
      }
    }
  }
  return;
}

Assistant:

void time_update(void)
{
	char buf[MSL], colbuf[MSL];
	char bw1[MSL], bw2[MSL], bw3[MSL], bw4[MSL];
	DESCRIPTOR_DATA *d;
	AREA_DATA *area;

	buf[0] = '\0';

	sprintf(bw1, "{rA ruddy glow fills the eastern sky as dawn approaches.{x");
	sprintf(bw2, "{YThe sky brightens as the great flaming disc peers above the eastern horizon.{x");
	sprintf(bw3, "{MThe sun slowly disappears below the western horizon.{x");
	sprintf(bw4, "{mThe violet glow leaves the western sky as evening gives way to night.{x");

	if (time_info.half)
	{
		time_info.half= false;

		/* Season affects sunrise/sunset! */
		switch (time_info.season)
		{
			case 0:
				switch (++time_info.hour)
				{
					case 7:
						sun = SolarPosition::Sunrise;
						sprintf(buf, "%s", bw1);
						break;
					case 8:
						sun = SolarPosition::Daylight;
						sprintf(buf, "%s", bw2);
						break;
					case 16:
						sun = SolarPosition::Sunset;
						sprintf(buf, "%s", bw3);
						break;
					case 17:
						sun = SolarPosition::Dark;
						sprintf(buf, "%s", bw4);
						break;
					case 24:
						time_info.hour = 0;
						time_info.day++;
						break;
				}

				break;
			case 1:
				switch (++time_info.hour)
				{
					case 6:
						sun = SolarPosition::Sunrise;
						sprintf(buf, "%s", bw1);
						break;
					case 7:
						sun = SolarPosition::Daylight;
						sprintf(buf, "%s", bw2);
						break;
					case 18:
						sun = SolarPosition::Sunset;
						sprintf(buf, "%s", bw3);
						break;
					case 19:
						sun = SolarPosition::Dark;
						sprintf(buf, "%s", bw4);
						break;
					case 24:
						time_info.hour = 0;
						time_info.day++;
						break;
				}

				break;
			case (2):
				switch (++time_info.hour)
				{
					case 5:
						sun = SolarPosition::Sunrise;
						sprintf(buf, "%s", bw1);
						break;
					case 6:
						sun = SolarPosition::Daylight;
						sprintf(buf, "%s", bw2);
						break;
					case 20:
						sun = SolarPosition::Sunset;
						sprintf(buf, "%s", bw3);
						break;
					case 21:
						sun = SolarPosition::Dark;
						sprintf(buf, "%s", bw4);
						break;
					case 24:
						time_info.hour = 0;
						time_info.day++;
						break;
				}

				break;
			case 3:
				switch (++time_info.hour)
				{
					case 6:
						sun = SolarPosition::Sunrise;
						sprintf(buf, "%s", bw1);
						break;
					case 7:
						sun = SolarPosition::Daylight;
						sprintf(buf, "%s", bw2);
						break;
					case 18:
						sun = SolarPosition::Sunset;
						sprintf(buf, "%s", bw3);
						break;
					case 19:
						sun = SolarPosition::Dark;
						sprintf(buf, "%s", bw4);
						break;
					case 24:
						time_info.hour = 0;
						time_info.day++;
						break;
				}

				break;
		}

		if (time_info.day >= 30)
		{
			time_info.day = 0;
			time_info.month++;

			if ((time_info.month + 1) % 3 == 0)
			{
				time_info.season++;
				if (time_info.season > 3)
					time_info.season = 0;
			}
		}

		if (time_info.month >= 12)
		{
			time_info.month = 0;
			time_info.year++;
			// update_guild_leader();
		}
	}
	else
	{
		time_info.half = true;
	}

	if (buf[0] != '\0')
	{
		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->connected == CON_PLAYING
				&& d->character->in_room
				&& d->character->in_room->sector_type != SECT_UNDERWATER
				&& is_outside(d->character)
				&& is_awake(d->character)
				&& !is_editing(d->character)
				&& !(is_affected_area(d->character->in_room->area, gsn_whiteout))
				&& !(is_affected_area(d->character->in_room->area, gsn_cyclone))
				&& !(is_affected_by(d->character, AFF_BLIND)))
			{
				colorconv(colbuf, buf, d->character);
				send_to_char(colbuf, d->character);
				send_to_char("\n\r", d->character);
			}
		}
	}

	if (buf[0] != '\0')
	{
		for (area = area_first; area != nullptr; area = area->next)
		{
			if (IS_SET(area->progtypes, APROG_SUN))
				(area->aprogs->sun_prog)(area);
		}
	}
}